

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall CLIntercept::checkRemoveKernelInfo(CLIntercept *this,cl_kernel kernel)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  pair<std::_Rb_tree_iterator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>,_std::_Rb_tree_iterator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
  pVar3;
  cl_uint refCount;
  int local_24;
  cl_kernel local_20;
  
  __mutex = &this->m_Mutex;
  local_20 = kernel;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_24 = 0;
    (*(this->m_Dispatch).clGetKernelInfo)(kernel,0x1192,4,&local_24,(size_t *)0x0);
    if (local_24 == 1) {
      pVar3 = std::
              _Rb_tree<_cl_kernel_*,_std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>,_std::_Select1st<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
              ::equal_range(&(this->m_KernelInfoMap)._M_t,&local_20);
      std::
      _Rb_tree<_cl_kernel_*,_std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>,_std::_Select1st<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
      ::_M_erase_aux(&(this->m_KernelInfoMap)._M_t,(_Base_ptr)pVar3.first._M_node,
                     (_Base_ptr)pVar3.second._M_node);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void CLIntercept::checkRemoveKernelInfo( cl_kernel kernel )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( kernel );
    if( refCount == 1 )
    {
#if 0
        // We shouldn't remove the kernel name from the local kernel name map
        // here since the mapping may be included in the device performance
        // time report.
        m_LongKernelNameMap.erase( m_KernelInfoMap[ kernel ].KernelName );
#endif

        m_KernelInfoMap.erase( kernel );
    }
}